

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utColladaExportCamera.cpp
# Opt level: O1

void __thiscall
ColladaExportCamera_testExportCamera_Test::TestBody(ColladaExportCamera_testExportCamera_Test *this)

{
  uint uVar1;
  aiString *paVar2;
  bool bVar3;
  int iVar4;
  aiCamera *paVar5;
  char *pcVar6;
  char *pcVar7;
  char *in_R9;
  undefined8 *puVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  float *pfVar12;
  bool bVar13;
  AssertionResult gtest_ar_;
  aiScene *imported;
  AssertionResult gtest_ar;
  uint origNumCams;
  aiScene *pTest;
  AssertHelper in_stack_ffffffffffffff48;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar14;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  AssertHelper in_stack_ffffffffffffff60;
  AssertHelper AVar15;
  internal in_stack_ffffffffffffff68;
  internal iVar16;
  undefined7 in_stack_ffffffffffffff69;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff70;
  undefined1 local_88 [20];
  uint local_74;
  undefined8 *local_70;
  aiCamera *local_68;
  AssertHelper local_60;
  void *local_58;
  void *local_50;
  void *local_48;
  aiScene *local_40;
  ColladaExportCamera_testExportCamera_Test *local_38;
  
  local_40 = Assimp::Importer::ReadFile
                       ((this->super_ColladaExportCamera).im,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/Collada/cameras.dae"
                        ,0x400);
  sVar14.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
            ((internal *)&stack0xffffffffffffff68,"nullptr","pTest",
             (void **)&stack0xffffffffffffff50,&local_40);
  if (in_stack_ffffffffffffff68 == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffff50);
    if (in_stack_ffffffffffffff70.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((in_stack_ffffffffffffff70.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
               ,0x4d,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff60,(Message *)&stack0xffffffffffffff50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff60);
    if (((sVar14.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (sVar14.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)sVar14.ptr_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&stack0xffffffffffffff70,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&stack0xffffffffffffff70,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    sVar14.ptr_ = sVar14.ptr_ & 0xffffffffffffff00;
    local_a8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_40->mNumCameras == 0 || local_40->mCameras == (aiCamera **)0x0) {
      testing::Message::Message((Message *)&stack0xffffffffffffff60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&stack0xffffffffffffff68,(internal *)&stack0xffffffffffffff50,
                 (AssertionResult *)"pTest->HasCameras()","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffff48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                 ,0x4e,(char *)CONCAT71(in_stack_ffffffffffffff69,in_stack_ffffffffffffff68));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffff48,(Message *)&stack0xffffffffffffff60);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff48);
      if ((undefined1 *)CONCAT71(in_stack_ffffffffffffff69,in_stack_ffffffffffffff68) != local_88) {
        operator_delete((undefined1 *)CONCAT71(in_stack_ffffffffffffff69,in_stack_ffffffffffffff68))
        ;
      }
      if (((in_stack_ffffffffffffff60.data_ != (AssertHelperData *)0x0) &&
          (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
         (in_stack_ffffffffffffff60.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)in_stack_ffffffffffffff60.data_ + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      sVar14.ptr_ = sVar14.ptr_ & 0xffffffff00000000;
      pcVar6 = (char *)0x0;
      Assimp::Exporter::Export
                ((this->super_ColladaExportCamera).ex,local_40,"collada","cameraExp.dae",0,
                 (ExportProperties *)0x0);
      testing::internal::CmpHelperEQ<aiReturn,aiReturn>
                ((internal *)&stack0xffffffffffffff68,"aiReturn_SUCCESS",
                 "ex->Export(pTest,\"collada\",file)",(aiReturn *)&stack0xffffffffffffff50,
                 (aiReturn *)&stack0xffffffffffffff60);
      if (in_stack_ffffffffffffff68 == (internal)0x0) {
        testing::Message::Message((Message *)&stack0xffffffffffffff50);
        if (in_stack_ffffffffffffff70.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = "";
        }
        else {
          pcVar9 = ((in_stack_ffffffffffffff70.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                   ,0x51,pcVar9);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffff60,(Message *)&stack0xffffffffffffff50);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff60);
        if (((sVar14.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
            (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
           (sVar14.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)sVar14.ptr_ + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&stack0xffffffffffffff70,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar1 = local_40->mNumCameras;
      uVar10 = (ulong)uVar1;
      uVar11 = uVar10 * 4;
      local_74 = uVar1;
      local_48 = operator_new__(uVar11);
      local_50 = operator_new__(uVar11);
      local_58 = operator_new__(uVar11);
      paVar5 = (aiCamera *)operator_new__(uVar10 * 0x404);
      local_68 = paVar5;
      if (uVar10 != 0) {
        paVar2 = &paVar5->mName;
        do {
          (paVar5->mName).length = 0;
          (paVar5->mName).data[0] = '\0';
          memset((paVar5->mName).data + 1,0x1b,0x3ff);
          paVar5 = (aiCamera *)&paVar5->mPosition;
        } while (paVar5 != (aiCamera *)(paVar2 + uVar10));
      }
      local_38 = this;
      local_70 = (undefined8 *)operator_new__(uVar10 * 0xc);
      if (uVar1 != 0) {
        memset(local_70,0,((uVar10 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      if (local_74 != 0) {
        uVar11 = 0;
        puVar8 = local_70;
        paVar5 = local_68;
        iVar16 = in_stack_ffffffffffffff68;
        do {
          sVar14.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_40->mCameras[uVar11];
          AVar15.data_ = (AssertHelperData *)0x0;
          testing::internal::CmpHelperNE<decltype(nullptr),aiCamera_const*>
                    ((internal *)&stack0xffffffffffffff68,"nullptr","orig",
                     (void **)&stack0xffffffffffffff60,(aiCamera **)&stack0xffffffffffffff50);
          if (iVar16 == (internal)0x0) {
            testing::Message::Message((Message *)&stack0xffffffffffffff60);
            if (in_stack_ffffffffffffff70.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar6 = "";
            }
            else {
              pcVar6 = ((in_stack_ffffffffffffff70.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xffffffffffffff48,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                       ,0x5a,pcVar6);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xffffffffffffff48,(Message *)&stack0xffffffffffffff60)
            ;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff48)
            ;
            if (((AVar15.data_ != (AssertHelperData *)0x0) &&
                (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
               (AVar15.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)AVar15.data_ + 8))();
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff70,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            goto LAB_0037b86a;
          }
          in_stack_ffffffffffffff68 = iVar16;
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&stack0xffffffffffffff70,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          *(float *)((long)local_48 + uVar11 * 4) = *(float *)(sVar14.ptr_ + 0x428);
          *(float *)((long)local_50 + uVar11 * 4) = *(float *)(sVar14.ptr_ + 0x42c);
          *(float *)((long)local_58 + uVar11 * 4) = *(float *)(sVar14.ptr_ + 0x430);
          if (paVar5 != (aiCamera *)sVar14.ptr_) {
            uVar1 = *(uint *)sVar14.ptr_;
            (paVar5->mName).length = uVar1;
            memcpy((paVar5->mName).data,sVar14.ptr_ + 4,(ulong)uVar1);
            (paVar5->mName).data[uVar1] = '\0';
          }
          *(float *)(puVar8 + 1) = *(float *)(sVar14.ptr_ + 0x40c);
          *puVar8 = *(undefined8 *)(sVar14.ptr_ + 0x404);
          if (iVar16 == (internal)0x0) goto LAB_0037b86a;
          uVar11 = uVar11 + 1;
          paVar5 = (aiCamera *)&paVar5->mPosition;
          puVar8 = (undefined8 *)((long)puVar8 + 0xc);
          iVar16 = in_stack_ffffffffffffff68;
        } while (uVar11 < local_74);
      }
      AVar15.data_ = (AssertHelperData *)
                     Assimp::Importer::ReadFile
                               ((local_38->super_ColladaExportCamera).im,"cameraExp.dae",0x400);
      sVar14.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
                ((internal *)&stack0xffffffffffffff68,"nullptr","imported",
                 (void **)&stack0xffffffffffffff50,(aiScene **)&stack0xffffffffffffff60);
      if (in_stack_ffffffffffffff68 == (internal)0x0) {
        testing::Message::Message((Message *)&stack0xffffffffffffff50);
        if (in_stack_ffffffffffffff70.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = ((in_stack_ffffffffffffff70.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff48,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                   ,100,pcVar6);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffff48,(Message *)&stack0xffffffffffffff50);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff48);
        if (((sVar14.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
            (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
           (sVar14.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)sVar14.ptr_ + 8))();
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&stack0xffffffffffffff70,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&stack0xffffffffffffff70,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        bVar3 = *(aiCamera ***)((long)&AVar15.data_[1].message.field_2 + 8) != (aiCamera **)0x0;
        bVar13 = *(uint *)&AVar15.data_[1].message.field_2 != 0;
        sVar14.ptr_._0_1_ = bVar13 && bVar3;
        local_a8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!bVar13 || !bVar3) {
          testing::Message::Message((Message *)&stack0xffffffffffffff48);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&stack0xffffffffffffff68,(internal *)&stack0xffffffffffffff50,
                     (AssertionResult *)"imported->HasCameras()","false","true",pcVar6);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                     ,0x66,(char *)CONCAT71(in_stack_ffffffffffffff69,in_stack_ffffffffffffff68));
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&stack0xffffffffffffff48);
          testing::internal::AssertHelper::~AssertHelper(&local_60);
          if ((undefined1 *)CONCAT71(in_stack_ffffffffffffff69,in_stack_ffffffffffffff68) !=
              local_88) {
            operator_delete((undefined1 *)
                            CONCAT71(in_stack_ffffffffffffff69,in_stack_ffffffffffffff68));
          }
          if (in_stack_ffffffffffffff48.data_ != (AssertHelperData *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && (in_stack_ffffffffffffff48.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)in_stack_ffffffffffffff48.data_ + 8))();
            }
            in_stack_ffffffffffffff48.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)&stack0xffffffffffffff68,"origNumCams","imported->mNumCameras",
                   &local_74,(uint *)&AVar15.data_[1].message.field_2._M_allocated_capacity);
        if (in_stack_ffffffffffffff68 == (internal)0x0) {
          testing::Message::Message((Message *)&stack0xffffffffffffff50);
          if (in_stack_ffffffffffffff70.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar9 = "";
          }
          else {
            pcVar9 = ((in_stack_ffffffffffffff70.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xffffffffffffff48,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                     ,0x67,pcVar9);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xffffffffffffff48,(Message *)&stack0xffffffffffffff50);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff48);
          if (sVar14.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) &&
               (sVar14.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)sVar14.ptr_ + 8))();
            }
            sVar14.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&stack0xffffffffffffff70,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if (*(uint *)&AVar15.data_[1].message.field_2 != 0) {
          pcVar9 = (local_68->mName).data;
          pfVar12 = (float *)(local_70 + 1);
          uVar11 = 0;
          do {
            paVar5 = (*(aiCamera ***)((long)&AVar15.data_[1].message.field_2 + 8))[uVar11];
            if (((aiString *)(pcVar9 + -4))->length == (paVar5->mName).length) {
              iVar4 = bcmp(pcVar9,(paVar5->mName).data,(ulong)((aiString *)(pcVar9 + -4))->length);
              sVar14.ptr_._0_1_ = iVar4 == 0;
              local_a8.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar4 != 0) goto LAB_0037b347;
            }
            else {
              sVar14.ptr_ = sVar14.ptr_ & 0xffffffffffffff00;
LAB_0037b347:
              local_a8.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              testing::Message::Message((Message *)&stack0xffffffffffffff48);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&stack0xffffffffffffff68,(internal *)&stack0xffffffffffffff50,
                         (AssertionResult *)"names[ i ] == read->mName","false","true",pcVar6);
              testing::internal::AssertHelper::AssertHelper
                        (&local_60,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                         ,0x6c,(char *)CONCAT71(in_stack_ffffffffffffff69,in_stack_ffffffffffffff68)
                        );
              testing::internal::AssertHelper::operator=
                        (&local_60,(Message *)&stack0xffffffffffffff48);
              testing::internal::AssertHelper::~AssertHelper(&local_60);
              if ((undefined1 *)CONCAT71(in_stack_ffffffffffffff69,in_stack_ffffffffffffff68) !=
                  local_88) {
                operator_delete((undefined1 *)
                                CONCAT71(in_stack_ffffffffffffff69,in_stack_ffffffffffffff68));
              }
              if (in_stack_ffffffffffffff48.data_ != (AssertHelperData *)0x0) {
                bVar3 = testing::internal::IsTrue(true);
                if ((bVar3) && (in_stack_ffffffffffffff48.data_ != (AssertHelperData *)0x0)) {
                  (**(code **)(*(long *)in_stack_ffffffffffffff48.data_ + 8))();
                }
                in_stack_ffffffffffffff48.data_ = (AssertHelperData *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_a8,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::DoubleNearPredFormat
                      ((char *)sVar14.ptr_,(char *)in_stack_ffffffffffffff48.data_,(char *)0x37b438,
                       (double)in_stack_ffffffffffffff70.ptr_,
                       (double)CONCAT71(in_stack_ffffffffffffff69,in_stack_ffffffffffffff68),
                       (double)AVar15.data_);
            if (in_stack_ffffffffffffff68 == (internal)0x0) {
              testing::Message::Message((Message *)&stack0xffffffffffffff50);
              pcVar7 = "";
              if (in_stack_ffffffffffffff70.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar7 = ((in_stack_ffffffffffffff70.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff48,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                         ,0x6d,pcVar7);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xffffffffffffff48,
                         (Message *)&stack0xffffffffffffff50);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff48);
              if (sVar14.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar3 = testing::internal::IsTrue(true);
                if ((bVar3) &&
                   (sVar14.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)sVar14.ptr_ + 8))();
                }
                sVar14.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff70,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)&stack0xffffffffffffff68,"orifClipPlaneNear[ i ]",
                       "read->mClipPlaneNear",*(float *)((long)local_50 + uVar11 * 4),
                       paVar5->mClipPlaneNear);
            if (in_stack_ffffffffffffff68 == (internal)0x0) {
              testing::Message::Message((Message *)&stack0xffffffffffffff50);
              pcVar7 = "";
              if (in_stack_ffffffffffffff70.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar7 = ((in_stack_ffffffffffffff70.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff48,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                         ,0x6e,pcVar7);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xffffffffffffff48,
                         (Message *)&stack0xffffffffffffff50);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff48);
              if (sVar14.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar3 = testing::internal::IsTrue(true);
                if ((bVar3) &&
                   (sVar14.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)sVar14.ptr_ + 8))();
                }
                sVar14.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff70,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)&stack0xffffffffffffff68,"orifClipPlaneFar[ i ]",
                       "read->mClipPlaneFar",*(float *)((long)local_58 + uVar11 * 4),
                       paVar5->mClipPlaneFar);
            if (in_stack_ffffffffffffff68 == (internal)0x0) {
              testing::Message::Message((Message *)&stack0xffffffffffffff50);
              pcVar7 = "";
              if (in_stack_ffffffffffffff70.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar7 = ((in_stack_ffffffffffffff70.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff48,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                         ,0x6f,pcVar7);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xffffffffffffff48,
                         (Message *)&stack0xffffffffffffff50);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff48);
              if (sVar14.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar3 = testing::internal::IsTrue(true);
                if ((bVar3) &&
                   (sVar14.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)sVar14.ptr_ + 8))();
                }
                sVar14.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff70,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)&stack0xffffffffffffff68,"pos[ i ].x","read->mPosition.x",
                       pfVar12[-2],(paVar5->mPosition).x);
            if (in_stack_ffffffffffffff68 == (internal)0x0) {
              testing::Message::Message((Message *)&stack0xffffffffffffff50);
              pcVar7 = "";
              if (in_stack_ffffffffffffff70.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar7 = ((in_stack_ffffffffffffff70.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff48,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                         ,0x71,pcVar7);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xffffffffffffff48,
                         (Message *)&stack0xffffffffffffff50);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff48);
              if (sVar14.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar3 = testing::internal::IsTrue(true);
                if ((bVar3) &&
                   (sVar14.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)sVar14.ptr_ + 8))();
                }
                sVar14.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff70,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)&stack0xffffffffffffff68,"pos[ i ].y","read->mPosition.y",
                       pfVar12[-1],(paVar5->mPosition).y);
            if (in_stack_ffffffffffffff68 == (internal)0x0) {
              testing::Message::Message((Message *)&stack0xffffffffffffff50);
              pcVar7 = "";
              if (in_stack_ffffffffffffff70.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar7 = ((in_stack_ffffffffffffff70.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff48,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                         ,0x72,pcVar7);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xffffffffffffff48,
                         (Message *)&stack0xffffffffffffff50);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff48);
              if (sVar14.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar3 = testing::internal::IsTrue(true);
                if ((bVar3) &&
                   (sVar14.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)sVar14.ptr_ + 8))();
                }
                sVar14.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff70,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)&stack0xffffffffffffff68,"pos[ i ].z","read->mPosition.z",
                       *pfVar12,(paVar5->mPosition).z);
            if (in_stack_ffffffffffffff68 == (internal)0x0) {
              testing::Message::Message((Message *)&stack0xffffffffffffff50);
              pcVar7 = "";
              if (in_stack_ffffffffffffff70.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar7 = ((in_stack_ffffffffffffff70.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff48,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                         ,0x73,pcVar7);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xffffffffffffff48,
                         (Message *)&stack0xffffffffffffff50);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff48);
              if (sVar14.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar3 = testing::internal::IsTrue(true);
                if ((bVar3) &&
                   (sVar14.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)sVar14.ptr_ + 8))();
                }
                sVar14.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff70,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            uVar11 = uVar11 + 1;
            pcVar9 = pcVar9 + 0x404;
            pfVar12 = pfVar12 + 3;
          } while (uVar11 < *(uint *)&AVar15.data_[1].message.field_2);
        }
      }
LAB_0037b86a:
      operator_delete__(local_70);
      operator_delete__(local_68);
      operator_delete__(local_58);
      operator_delete__(local_50);
      operator_delete__(local_48);
    }
  }
  return;
}

Assistant:

TEST_F(ColladaExportCamera, testExportCamera) {
    const char* file = "cameraExp.dae";

    const aiScene* pTest = im->ReadFile(ASSIMP_TEST_MODELS_DIR "/Collada/cameras.dae", aiProcess_ValidateDataStructure);
    ASSERT_NE( nullptr, pTest );
    ASSERT_TRUE(pTest->HasCameras());


    EXPECT_EQ( AI_SUCCESS, ex->Export(pTest,"collada",file));
    const unsigned int origNumCams( pTest->mNumCameras );
    std::unique_ptr<float[]> origFOV( new float[ origNumCams ] );
    std::unique_ptr<float[]> orifClipPlaneNear( new float[ origNumCams ] );
    std::unique_ptr<float[]> orifClipPlaneFar( new float[ origNumCams ] );
    std::unique_ptr<aiString[]> names( new aiString[ origNumCams ] );
    std::unique_ptr<aiVector3D[]> pos( new aiVector3D[ origNumCams ] );
    for (size_t i = 0; i < origNumCams; i++) {
        const aiCamera *orig = pTest->mCameras[ i ];
        ASSERT_NE(nullptr, orig );

        origFOV[ i ] = orig->mHorizontalFOV;
        orifClipPlaneNear[ i ] = orig->mClipPlaneNear;
        orifClipPlaneFar[ i ] = orig->mClipPlaneFar;
        names[ i ] = orig->mName;
        pos[ i ] = orig->mPosition;
    }
    const aiScene* imported = im->ReadFile(file, aiProcess_ValidateDataStructure);

    ASSERT_NE(nullptr, imported );

    EXPECT_TRUE( imported->HasCameras() );
    EXPECT_EQ( origNumCams, imported->mNumCameras );

    for(size_t i=0; i< imported->mNumCameras;i++){
        const aiCamera *read = imported->mCameras[ i ];

        EXPECT_TRUE( names[ i ] == read->mName );
        EXPECT_NEAR( origFOV[ i ],read->mHorizontalFOV, 0.0001f );
        EXPECT_FLOAT_EQ( orifClipPlaneNear[ i ], read->mClipPlaneNear);
        EXPECT_FLOAT_EQ( orifClipPlaneFar[ i ], read->mClipPlaneFar);

        EXPECT_FLOAT_EQ( pos[ i ].x,read->mPosition.x);
        EXPECT_FLOAT_EQ( pos[ i ].y,read->mPosition.y);
        EXPECT_FLOAT_EQ( pos[ i ].z,read->mPosition.z);
    }
}